

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::match(Lexer *this,char *x)

{
  ostream *poVar1;
  lexer_exception *this_00;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream buffer;
  ostream local_198 [383];
  bool local_19;
  char *local_18;
  char *x_local;
  Lexer *this_local;
  
  local_18 = x;
  x_local = &this->npos;
  if (this->current_ == *x) {
    local_19 = true;
    consume(this,&local_19);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,anon_var_dwarf_325c3);
  poVar1 = std::operator<<(poVar1,this->current_);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_325dc);
  poVar1 = std::operator<<(poVar1,*local_18);
  std::operator<<(poVar1,anon_var_dwarf_325c3 + 0x10);
  this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  lexer_exception::lexer_exception(this_00,&this->position_,&local_1d8);
  __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
}

Assistant:

void Lexer::match(const char &x) {
    if (current_ == x) {
        consume();
    } else {
        std::stringstream buffer;
        buffer << "错误的字符 '" << current_ << "', 期望得到 '" << x << "'";
        throw lexer_exception(position_, buffer.str());
    }
}